

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
trieste::SourceDef::linecol(SourceDef *this,size_t pos)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  long lVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  size_t local_18;
  
  local_18 = pos;
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_18);
  lVar2 = (long)_Var1._M_current -
          (long)(this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    local_18 = local_18 + ~_Var1._M_current[-1];
  }
  pVar3.first = lVar2 >> 3;
  pVar3.second = local_18;
  return pVar3;
}

Assistant:

std::pair<size_t, size_t> linecol(size_t pos) const
    {
      // Lines and columns are 0-indexed.
      auto it = std::lower_bound(lines.begin(), lines.end(), pos);

      auto line = it - lines.begin();
      auto col = pos;

      if (it != lines.begin())
        col -= *(it - 1) + 1;

      return {line, col};
    }